

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

ssize_t __thiscall JSON::JSON_string::write(JSON_string *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  void *local_20;
  size_t param_2_local;
  Pipeline *p_local;
  JSON_string *this_local;
  
  local_20 = __buf;
  param_2_local = (size_t)CONCAT44(in_register_00000034,__fd);
  p_local = (Pipeline *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"\"",&local_81);
  Writer::encode_string(&local_b8,&this->utf8);
  std::operator+(&local_60,&local_80,&local_b8);
  std::operator+(&local_40,&local_60,"\"");
  Pipeline::operator<<((Pipeline *)CONCAT44(in_register_00000034,__fd),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  sVar1 = std::allocator<char>::~allocator(&local_81);
  return sVar1;
}

Assistant:

void
JSON::JSON_string::write(Pipeline* p, size_t) const
{
    *p << std::string("\"") + Writer::encode_string(utf8) + "\"";
}